

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyzer.cpp
# Opt level: O2

void __thiscall
SemanticAnalyzerRun::onExitFunctionDeclarationExpressionAstNode
          (SemanticAnalyzerRun *this,FunctionDeclarationExpressionAstNode *node)

{
  size_t sVar1;
  iterator iVar2;
  string local_48;
  FunctionDeclarationExpressionAstNode *local_28;
  FunctionDeclarationExpressionAstNode *node_local;
  
  sVar1 = this->functionDept;
  local_28 = node;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "Expected a non zero function dept when calling onExitFunctionDeclarationExpressionAstNode"
             ,(allocator<char> *)((long)&node_local + 7));
  Error::assertWithPanic(sVar1 != 0,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  this->functionDept = this->functionDept - 1;
  iVar2 = std::
          _Hashtable<FunctionDeclarationExpressionAstNode_*,_std::pair<FunctionDeclarationExpressionAstNode_*const,_bool>,_std::allocator<std::pair<FunctionDeclarationExpressionAstNode_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<FunctionDeclarationExpressionAstNode_*>,_std::hash<FunctionDeclarationExpressionAstNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->inLoopState)._M_h,&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"Could not find a key in inLoopState map for function declaration",
             (allocator<char> *)((long)&node_local + 7));
  Error::assertWithPanic
            (iVar2.
             super__Node_iterator_base<std::pair<FunctionDeclarationExpressionAstNode_*const,_bool>,_false>
             ._M_cur != (__node_type *)0x0,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  this->inLoop = *(bool *)((long)iVar2.
                                 super__Node_iterator_base<std::pair<FunctionDeclarationExpressionAstNode_*const,_bool>,_false>
                                 ._M_cur + 0x10);
  popScope(this);
  return;
}

Assistant:

void onExitFunctionDeclarationExpressionAstNode(FunctionDeclarationExpressionAstNode* node) noexcept override {
    Error::assertWithPanic(
      this->functionDept != 0,
      "Expected a non zero function dept when calling onExitFunctionDeclarationExpressionAstNode");

    this->functionDept--;

    auto search = this->inLoopState.find(node);

    Error::assertWithPanic(
      search != this->inLoopState.end(),
      "Could not find a key in inLoopState map for function declaration");

    this->inLoop = search->second;

    this->popScope();
  }